

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O2

void get_msurf_descriptor_haar_unroll_2_1_False(integral_image *iimage,interest_point *ipoint)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int i;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int k_count;
  long lVar19;
  float *pfVar20;
  long lVar21;
  long lVar22;
  float *pfVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  float *pfVar27;
  int iVar28;
  int k_count_1;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar57;
  undefined1 in_ZMM8 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar60;
  undefined1 auVar61 [64];
  
  auVar39._8_4_ = 0x3effffff;
  auVar39._0_8_ = 0x3effffff3effffff;
  auVar39._12_4_ = 0x3effffff;
  auVar38._8_4_ = 0x80000000;
  auVar38._0_8_ = 0x8000000080000000;
  auVar38._12_4_ = 0x80000000;
  fVar46 = ipoint->scale;
  auVar61 = ZEXT464((uint)fVar46);
  auVar40 = ZEXT416((uint)fVar46);
  auVar31 = vpternlogd_avx512vl(auVar39,auVar40,auVar38,0xf8);
  auVar31 = ZEXT416((uint)(fVar46 + auVar31._0_4_));
  auVar31 = vroundss_avx(auVar31,auVar31,0xb);
  fVar43 = -0.08 / (fVar46 * fVar46);
  iVar18 = (int)auVar31._0_4_;
  auVar32._0_4_ = (int)auVar31._0_4_;
  auVar32._4_4_ = (int)auVar31._4_4_;
  auVar32._8_4_ = (int)auVar31._8_4_;
  auVar32._12_4_ = (int)auVar31._12_4_;
  auVar31 = vcvtdq2ps_avx(auVar32);
  auVar32 = vpternlogd_avx512vl(auVar39,ZEXT416((uint)ipoint->x),auVar38,0xf8);
  auVar32 = ZEXT416((uint)(ipoint->x + auVar32._0_4_));
  auVar32 = vroundss_avx(auVar32,auVar32,0xb);
  auVar33._0_8_ = (double)auVar32._0_4_;
  auVar33._8_8_ = auVar32._8_8_;
  auVar37._0_8_ = (double)fVar46;
  auVar37._8_8_ = 0;
  auVar32 = vfmadd231sd_fma(auVar33,auVar37,ZEXT816(0x3fe0000000000000));
  auVar36._0_4_ = (float)auVar32._0_8_;
  auVar36._4_12_ = auVar32._4_12_;
  auVar32 = vpternlogd_avx512vl(auVar39,ZEXT416((uint)ipoint->y),auVar38,0xf8);
  fVar3 = auVar36._0_4_ - auVar31._0_4_;
  auVar32 = ZEXT416((uint)(ipoint->y + auVar32._0_4_));
  auVar32 = vroundss_avx(auVar32,auVar32,0xb);
  auVar34._0_8_ = (double)auVar32._0_4_;
  auVar34._8_8_ = auVar32._8_8_;
  auVar32 = vfmadd231sd_fma(auVar34,auVar37,ZEXT816(0x3fe0000000000000));
  auVar35._0_4_ = (float)auVar32._0_8_;
  auVar35._4_12_ = auVar32._4_12_;
  fVar60 = auVar35._0_4_ - auVar31._0_4_;
  auVar33 = ZEXT416((uint)fVar46);
  auVar31 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar33,auVar36);
  auVar32 = vpternlogd_avx512vl(auVar39,auVar31,auVar38,0xf8);
  auVar31 = ZEXT416((uint)(auVar31._0_4_ + auVar32._0_4_));
  auVar31 = vroundss_avx(auVar31,auVar31,0xb);
  if (iVar18 < (int)auVar31._0_4_) {
    auVar41._8_4_ = 0x3effffff;
    auVar41._0_8_ = 0x3effffff3effffff;
    auVar41._12_4_ = 0x3effffff;
    auVar42._8_4_ = 0x80000000;
    auVar42._0_8_ = 0x8000000080000000;
    auVar42._12_4_ = 0x80000000;
    auVar31 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar33,auVar35);
    auVar32 = vpternlogd_avx512vl(auVar42,auVar31,auVar41,0xea);
    auVar31 = ZEXT416((uint)(auVar31._0_4_ + auVar32._0_4_));
    auVar31 = vroundss_avx(auVar31,auVar31,0xb);
    if (iVar18 < (int)auVar31._0_4_) {
      auVar31 = vfmadd231ss_fma(auVar36,auVar33,ZEXT416(0x41300000));
      auVar55._8_4_ = 0x80000000;
      auVar55._0_8_ = 0x8000000080000000;
      auVar55._12_4_ = 0x80000000;
      auVar32 = vpternlogd_avx512vl(auVar55,auVar31,auVar41,0xea);
      auVar31 = ZEXT416((uint)(auVar31._0_4_ + auVar32._0_4_));
      auVar31 = vroundss_avx(auVar31,auVar31,0xb);
      if ((int)auVar31._0_4_ + iVar18 <= iimage->width) {
        auVar31 = vfmadd231ss_fma(auVar35,auVar33,ZEXT416(0x41300000));
        auVar12._8_4_ = 0x80000000;
        auVar12._0_8_ = 0x8000000080000000;
        auVar12._12_4_ = 0x80000000;
        auVar32 = vpternlogd_avx512vl(auVar41,auVar31,auVar12,0xf8);
        auVar31 = ZEXT416((uint)(auVar31._0_4_ + auVar32._0_4_));
        auVar31 = vroundss_avx(auVar31,auVar31,0xb);
        if ((int)auVar31._0_4_ + iVar18 <= iimage->height) {
          lVar22 = 0x60;
          for (uVar15 = 0xfffffff4; (int)uVar15 < 0xc; uVar15 = uVar15 + 2) {
            auVar31._0_4_ = (float)(int)uVar15;
            auVar31._4_12_ = in_ZMM8._4_12_;
            lVar19 = 0;
            auVar31 = vfmadd213ss_fma(auVar31,auVar61._0_16_,ZEXT416((uint)(fVar60 + 0.5)));
            auVar49._0_4_ = (float)(int)(uVar15 | 1);
            auVar49._4_12_ = in_ZMM8._4_12_;
            auVar32 = vfmadd213ss_fma(auVar49,auVar61._0_16_,ZEXT416((uint)(fVar60 + 0.5)));
            lVar21 = lVar22;
            for (; lVar19 != 0x18; lVar19 = lVar19 + 1) {
              auVar50._0_4_ = (float)((int)lVar19 + -0xc);
              auVar50._4_12_ = in_ZMM8._4_12_;
              auVar33 = vfmadd132ss_fma(auVar50,ZEXT416((uint)(fVar3 + 0.5)),ZEXT416((uint)fVar46));
              haarXY_unconditional
                        (iimage,(int)auVar31._0_4_,(int)auVar33._0_4_,iVar18,
                         (float *)((long)haarResponseX + lVar21 + -0x60),
                         (float *)((long)haarResponseY + lVar21 + -0x60));
              haarXY_unconditional
                        (iimage,(int)auVar32._0_4_,(int)auVar33._0_4_,iVar18,
                         (float *)((long)haarResponseX + lVar21),
                         (float *)((long)haarResponseY + lVar21));
              lVar21 = lVar21 + 4;
            }
            auVar61 = ZEXT1664(auVar40);
            lVar22 = lVar22 + 0xc0;
          }
          goto LAB_00168124;
        }
      }
    }
  }
  lVar22 = 0x60;
  for (uVar15 = 0xfffffff4; (int)uVar15 < 0xc; uVar15 = uVar15 + 2) {
    auVar47._0_4_ = (float)(int)uVar15;
    auVar47._4_12_ = in_ZMM8._4_12_;
    auVar31 = vfmadd213ss_fma(auVar47,auVar61._0_16_,ZEXT416((uint)fVar60));
    auVar52._0_4_ = (float)(int)(uVar15 | 1);
    auVar52._4_12_ = in_ZMM8._4_12_;
    fVar44 = auVar31._0_4_;
    auVar31 = vfmadd213ss_fma(auVar52,auVar61._0_16_,ZEXT416((uint)fVar60));
    fVar51 = auVar31._0_4_;
    lVar21 = lVar22;
    for (lVar19 = 0; lVar19 != 0x18; lVar19 = lVar19 + 1) {
      auVar48._0_4_ = (float)((int)lVar19 + -0xc);
      auVar48._4_12_ = in_ZMM8._4_12_;
      auVar31 = vfmadd132ss_fma(auVar48,ZEXT416((uint)fVar3),ZEXT416((uint)fVar46));
      fVar45 = auVar31._0_4_;
      iVar28 = (int)((double)((ulong)(0.0 <= fVar45) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar45) * -0x4020000000000000) + (double)fVar45);
      haarXY_precheck_boundaries
                (iimage,(int)((double)((ulong)(0.0 <= fVar44) * 0x3fe0000000000000 +
                                      (ulong)(0.0 > fVar44) * -0x4020000000000000) + (double)fVar44)
                 ,iVar28,iVar18,(float *)((long)haarResponseX + lVar21 + -0x60),
                 (float *)((long)haarResponseY + lVar21 + -0x60));
      haarXY_precheck_boundaries
                (iimage,(int)((double)((ulong)(0.0 <= fVar51) * 0x3fe0000000000000 +
                                      (ulong)(0.0 > fVar51) * -0x4020000000000000) + (double)fVar51)
                 ,iVar28,iVar18,(float *)((long)haarResponseX + lVar21),
                 (float *)((long)haarResponseY + lVar21));
      lVar21 = lVar21 + 4;
    }
    auVar61 = ZEXT1664(auVar40);
    lVar22 = lVar22 + 0xc0;
  }
LAB_00168124:
  fVar60 = auVar61._0_4_;
  auVar59._8_4_ = 0x3effffff;
  auVar59._0_8_ = 0x3effffff3effffff;
  auVar59._12_4_ = 0x3effffff;
  auVar58._8_4_ = 0x80000000;
  auVar58._0_8_ = 0x8000000080000000;
  auVar58._12_4_ = 0x80000000;
  auVar31 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)(fVar60 * 0.5)),auVar58,0xf8);
  auVar31 = ZEXT416((uint)(fVar60 * 0.5 + auVar31._0_4_));
  auVar31 = vroundss_avx(auVar31,auVar31,0xb);
  auVar32 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)(fVar60 * 1.5)),auVar58,0xf8);
  auVar32 = ZEXT416((uint)(fVar60 * 1.5 + auVar32._0_4_));
  auVar32 = vroundss_avx(auVar32,auVar32,0xb);
  auVar33 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)(fVar60 * 2.5)),auVar58,0xf8);
  auVar33 = ZEXT416((uint)(fVar60 * 2.5 + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  auVar34 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)(fVar60 * 3.5)),auVar58,0xf8);
  auVar34 = ZEXT416((uint)(fVar60 * 3.5 + auVar34._0_4_));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  auVar35 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)(fVar60 * 4.5)),auVar58,0xf8);
  auVar35 = ZEXT416((uint)(fVar60 * 4.5 + auVar35._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  auVar36 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)(fVar60 * 5.5)),auVar58,0xf8);
  auVar36 = ZEXT416((uint)(fVar60 * 5.5 + auVar36._0_4_));
  auVar36 = vroundss_avx(auVar36,auVar36,0xb);
  auVar37 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)(fVar60 * 6.5)),auVar58,0xf8);
  auVar37 = ZEXT416((uint)(fVar60 * 6.5 + auVar37._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar38 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)(fVar60 * 7.5)),auVar58,0xf8);
  auVar38 = ZEXT416((uint)(auVar38._0_4_ + fVar60 * 7.5));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  auVar39 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)(fVar60 * 8.5)),auVar58,0xf8);
  auVar39 = ZEXT416((uint)(fVar60 * 8.5 + auVar39._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar40 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)(fVar60 * 9.5)),auVar58,0xf8);
  auVar40 = ZEXT416((uint)(fVar60 * 9.5 + auVar40._0_4_));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)(fVar60 * 10.5)),auVar58,0xf8);
  auVar41 = ZEXT416((uint)(fVar60 * 10.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar59,ZEXT416((uint)(fVar60 * 11.5)),auVar58,0xf8);
  fVar53 = auVar33._0_4_;
  fVar46 = fVar53 + auVar32._0_4_;
  fVar3 = fVar53 + auVar31._0_4_;
  auVar33 = ZEXT416((uint)(fVar60 * 11.5 + auVar42._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  fVar60 = fVar53 - auVar31._0_4_;
  fVar44 = fVar53 - auVar32._0_4_;
  fVar51 = fVar53 - auVar34._0_4_;
  fVar45 = fVar53 - auVar35._0_4_;
  fVar4 = fVar53 - auVar36._0_4_;
  fVar53 = fVar53 - auVar37._0_4_;
  fVar57 = auVar38._0_4_;
  fVar5 = fVar57 - auVar34._0_4_;
  fVar6 = fVar57 - auVar35._0_4_;
  fVar7 = fVar57 - auVar36._0_4_;
  fVar8 = fVar57 - auVar37._0_4_;
  fVar9 = fVar57 - auVar39._0_4_;
  fVar10 = fVar57 - auVar40._0_4_;
  fVar11 = fVar57 - auVar41._0_4_;
  fVar57 = fVar57 - auVar33._0_4_;
  gauss_s1_c0[0] = expf(fVar46 * fVar46 * fVar43);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar43);
  gauss_s1_c0[2] = expf(fVar60 * fVar60 * fVar43);
  gauss_s1_c0[3] = expf(fVar44 * fVar44 * fVar43);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar51 * fVar51 * fVar43);
  gauss_s1_c0[6] = expf(fVar45 * fVar45 * fVar43);
  gauss_s1_c0[7] = expf(fVar4 * fVar4 * fVar43);
  gauss_s1_c0[8] = expf(fVar53 * fVar53 * fVar43);
  gauss_s1_c1[0] = expf(fVar5 * fVar5 * fVar43);
  gauss_s1_c1[1] = expf(fVar6 * fVar6 * fVar43);
  gauss_s1_c1[2] = expf(fVar7 * fVar7 * fVar43);
  gauss_s1_c1[3] = expf(fVar8 * fVar8 * fVar43);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar9 * fVar9 * fVar43);
  gauss_s1_c1[6] = expf(fVar10 * fVar10 * fVar43);
  gauss_s1_c1[7] = expf(fVar11 * fVar11 * fVar43);
  gauss_s1_c1[8] = expf(fVar57 * fVar57 * fVar43);
  auVar61 = ZEXT1264(ZEXT812(0));
  lVar22 = 0;
  auVar40._8_4_ = 0x7fffffff;
  auVar40._0_8_ = 0x7fffffff7fffffff;
  auVar40._12_4_ = 0x7fffffff;
  iVar18 = 0;
  lVar21 = 0;
  uVar17 = 0xfffffffffffffff8;
  while (uVar15 = (uint)uVar17, (int)uVar15 < 8) {
    pfVar23 = gauss_s1_c1;
    if (uVar15 != 7) {
      pfVar23 = gauss_s1_c0;
    }
    lVar19 = (long)iVar18;
    lVar21 = (long)(int)lVar21;
    iVar18 = iVar18 + 4;
    if (uVar15 == 0xfffffff8) {
      pfVar23 = gauss_s1_c1;
    }
    uVar30 = 0;
    uVar29 = 0xfffffffffffffff8;
    lVar14 = lVar22;
    while (lVar19 != iVar18) {
      pfVar20 = gauss_s1_c1;
      iVar28 = (int)uVar29;
      if (iVar28 != 7) {
        pfVar20 = gauss_s1_c0;
      }
      auVar54 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar29 = (ulong)((uint)(uVar29 >> 0x1c) & 8);
      if (iVar28 == -8) {
        pfVar20 = gauss_s1_c1;
      }
      lVar24 = (long)haarResponseX + lVar14;
      lVar25 = (long)haarResponseY + lVar14;
      for (uVar16 = uVar30; uVar16 < iVar28 * 0x18 + 0x198; uVar16 = uVar16 + 0x18) {
        lVar26 = 0;
        pfVar27 = (float *)((long)pfVar23 + (ulong)(((uint)(uVar17 >> 0x1f) & 1) << 5));
        while (lVar26 != 9) {
          fVar46 = *pfVar27;
          pfVar27 = pfVar27 + (ulong)(~uVar15 >> 0x1f) * 2 + -1;
          lVar1 = lVar26 * 4;
          lVar2 = lVar26 * 4;
          lVar26 = lVar26 + 1;
          auVar33 = ZEXT416((uint)(pfVar20[uVar29] * fVar46 * *(float *)(lVar24 + lVar2)));
          auVar31 = vandps_avx(auVar33,auVar40);
          auVar34 = ZEXT416((uint)(pfVar20[uVar29] * fVar46 * *(float *)(lVar25 + lVar1)));
          auVar32 = vandps_avx(auVar34,auVar40);
          auVar33 = vinsertps_avx(auVar34,auVar33,0x10);
          auVar32 = vmovlhps_avx(auVar33,auVar32);
          auVar31 = vinsertps_avx(auVar32,auVar31,0x30);
          auVar54 = ZEXT1664(CONCAT412(auVar54._12_4_ + auVar31._12_4_,
                                       CONCAT48(auVar54._8_4_ + auVar31._8_4_,
                                                CONCAT44(auVar54._4_4_ + auVar31._4_4_,
                                                         auVar54._0_4_ + auVar31._0_4_))));
        }
        uVar29 = uVar29 + (ulong)(-1 < iVar28) * 2 + -1;
        lVar24 = lVar24 + 0x60;
        lVar25 = lVar25 + 0x60;
      }
      uVar29 = (ulong)(iVar28 + 5);
      uVar30 = uVar30 + 0x78;
      lVar14 = lVar14 + 0x1e0;
      fVar46 = gauss_s2_arr[lVar19];
      auVar13._4_4_ = fVar46;
      auVar13._0_4_ = fVar46;
      auVar13._8_4_ = fVar46;
      auVar13._12_4_ = fVar46;
      auVar34 = vmulps_avx512vl(auVar54._0_16_,auVar13);
      lVar19 = lVar19 + 1;
      auVar56._0_4_ = auVar34._0_4_ * auVar34._0_4_;
      auVar56._4_4_ = auVar34._4_4_ * auVar34._4_4_;
      auVar56._8_4_ = auVar34._8_4_ * auVar34._8_4_;
      auVar56._12_4_ = auVar34._12_4_ * auVar34._12_4_;
      auVar32 = vshufpd_avx(auVar34,auVar34,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar21) = auVar34;
      lVar21 = lVar21 + 4;
      auVar31 = vmovshdup_avx(auVar56);
      auVar33 = vfmadd231ss_fma(auVar31,auVar34,auVar34);
      auVar31 = vshufps_avx(auVar34,auVar34,0xff);
      auVar32 = vfmadd213ss_fma(auVar32,auVar32,auVar33);
      auVar31 = vfmadd213ss_fma(auVar31,auVar31,auVar32);
      auVar61 = ZEXT464((uint)(auVar61._0_4_ + auVar31._0_4_));
    }
    lVar22 = lVar22 + 0x14;
    uVar17 = (ulong)(uVar15 + 5);
  }
  if (auVar61._0_4_ < 0.0) {
    fVar46 = sqrtf(auVar61._0_4_);
  }
  else {
    auVar31 = vsqrtss_avx(auVar61._0_16_,auVar61._0_16_);
    fVar46 = auVar31._0_4_;
  }
  for (lVar22 = 0; lVar22 != 0x40; lVar22 = lVar22 + 1) {
    ipoint->descriptor[lVar22] = (1.0 / fVar46) * ipoint->descriptor[lVar22];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_1_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}